

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O1

StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::operator>>(StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *val)

{
  istream *piVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  string lexeme;
  char *local_98;
  undefined8 local_90;
  char local_88;
  undefined7 uStack_87;
  cpp_dec_float<100U,_int,_void> local_78;
  
  local_90 = 0;
  local_88 = '\0';
  local_98 = &local_88;
  do {
    piVar1 = std::operator>>(this->inp,(string *)&local_98);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      (this->
      super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ).finished = true;
      goto LAB_00110410;
    }
    cVar3 = *local_98;
    bVar4 = cVar3 == '\0';
    if (!bVar4) {
      lVar2 = 0;
      do {
        if ((9 < (int)cVar3 - 0x30U) && ((cVar3 != '-' || (lVar2 != 0)))) break;
        cVar3 = local_98[lVar2 + 1];
        lVar2 = lVar2 + 1;
        bVar4 = cVar3 == '\0';
      } while (!bVar4);
    }
  } while (!bVar4);
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 0x10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems[6] = 0;
  local_78.data._M_elems[7] = 0;
  local_78.data._M_elems[8] = 0;
  local_78.data._M_elems[9] = 0;
  local_78.data._M_elems[10] = 0;
  local_78.data._M_elems[0xb] = 0;
  local_78.data._M_elems[0xc] = 0;
  local_78.data._M_elems[0xd] = 0;
  local_78.data._M_elems._56_5_ = 0;
  local_78.data._M_elems[0xf]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string(&local_78,local_98);
  *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_78.data._M_elems._48_8_;
  *(ulong *)((val->m_backend).data._M_elems + 0xe) =
       CONCAT35(local_78.data._M_elems[0xf]._1_3_,local_78.data._M_elems._56_5_);
  *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_78.data._M_elems._32_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_78.data._M_elems._40_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_78.data._M_elems._16_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_78.data._M_elems._24_8_;
  *(undefined8 *)(val->m_backend).data._M_elems = local_78.data._M_elems._0_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_78.data._M_elems._8_8_;
  (val->m_backend).exp = local_78.exp;
  (val->m_backend).neg = local_78.neg;
  (val->m_backend).fpclass = local_78.fpclass;
  (val->m_backend).prec_elem = local_78.prec_elem;
LAB_00110410:
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return this;
}

Assistant:

StreamReader &operator>>(ValueType &val) override {
        std::string lexeme;
        while (inp >> lexeme) {
            if (!IsInteger(lexeme.c_str())) {
                continue;
            }
            val = ReadInteger<ValueType>(lexeme.c_str());
            return *this;
        }
        this->finished = true;
        return *this;
    }